

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

MacroSymbol * __thiscall glslang::TPpContext::lookupMacroDef(TPpContext *this,int atom)

{
  iterator iVar1;
  MacroSymbol *pMVar2;
  int local_c;
  
  local_c = atom;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_glslang::TPpContext::MacroSymbol>,_std::_Select1st<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_glslang::TPpContext::MacroSymbol>,_std::_Select1st<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
                  *)&this->macroDefs,&local_c);
  pMVar2 = (MacroSymbol *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->macroDefs).
       super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    pMVar2 = (MacroSymbol *)&iVar1._M_node[1]._M_parent;
  }
  return pMVar2;
}

Assistant:

MacroSymbol* lookupMacroDef(int atom)
    {
        auto existingMacroIt = macroDefs.find(atom);
        return (existingMacroIt == macroDefs.end()) ? nullptr : &(existingMacroIt->second);
    }